

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.h
# Opt level: O0

XXH128_hash_t
XXH3_128bits_internal
          (void *input,size_t len,XXH64_hash_t seed64,void *secret,size_t secretLen,
          XXH3_hashLong128_f f_hl128)

{
  undefined8 in_RCX;
  XXH64_hash_t in_RDX;
  xxh_u8 *in_RSI;
  size_t in_RDI;
  undefined8 in_R8;
  code *in_R9;
  XXH128_hash_t XVar1;
  XXH64_hash_t unaff_retaddr;
  xxh_u8 *in_stack_fffffffffffffff0;
  
  if (in_RSI < (xxh_u8 *)0x11) {
    XVar1 = XXH3_len_0to16_128b(in_stack_fffffffffffffff0,in_RDI,in_RSI,in_RDX);
  }
  else if (in_RSI < (xxh_u8 *)0x81) {
    XVar1 = XXH3_len_17to128_128b
                      ((xxh_u8 *)seed64,(size_t)secret,(xxh_u8 *)secretLen,(size_t)f_hl128,
                       unaff_retaddr);
  }
  else if (in_RSI < (xxh_u8 *)0xf1) {
    XVar1 = XXH3_len_129to240_128b
                      ((xxh_u8 *)seed64,(size_t)secret,(xxh_u8 *)secretLen,(size_t)f_hl128,
                       unaff_retaddr);
  }
  else {
    XVar1 = (XXH128_hash_t)(*in_R9)(in_RDI,in_RSI,in_RDX,in_RCX,in_R8);
  }
  return XVar1;
}

Assistant:

XXH_FORCE_INLINE XXH128_hash_t
XXH3_128bits_internal(const void* input, size_t len, XXH64_hash_t seed64,
                      const void* XXH_RESTRICT secret, size_t secretLen,
                      XXH3_hashLong128_f f_hl128) {
  XXH_ASSERT(secretLen >= XXH3_SECRET_SIZE_MIN);
  /*
   * If an action is to be taken if `secret` conditions are not respected,
   * it should be done here.
   * For now, it's a contract pre-condition.
   * Adding a check and a branch here would cost performance at every hash.
   */
  if (len <= 16)
    return XXH3_len_0to16_128b((const xxh_u8*)input, len, (const xxh_u8*)secret,
                               seed64);
  if (len <= 128)
    return XXH3_len_17to128_128b((const xxh_u8*)input, len,
                                 (const xxh_u8*)secret, secretLen, seed64);
  if (len <= XXH3_MIDSIZE_MAX)
    return XXH3_len_129to240_128b((const xxh_u8*)input, len,
                                  (const xxh_u8*)secret, secretLen, seed64);
  return f_hl128(input, len, seed64, secret, secretLen);
}